

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  uint p_value;
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar1;
  OPJ_BOOL l_result;
  OPJ_BYTE *l_current_data_ptr;
  OPJ_BYTE *l_ftyp_data;
  OPJ_UINT32 l_ftyp_size;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *cio_local;
  opj_jp2_t *jp2_local;
  
  if (cio == (opj_stream_private_t *)0x0) {
    __assert_fail("cio != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x6f5,
                  "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      p_value = jp2->numcl * 4 + 0x10;
      p_buffer = (OPJ_BYTE *)opj_calloc(1,(ulong)p_value);
      if (p_buffer == (OPJ_BYTE *)0x0) {
        opj_event_msg(p_manager,1,"Not enough memory to handle ftyp data\n");
        jp2_local._4_4_ = 0;
      }
      else {
        opj_write_bytes_LE(p_buffer,p_value,4);
        opj_write_bytes_LE(p_buffer + 4,0x66747970,4);
        opj_write_bytes_LE(p_buffer + 8,jp2->brand,4);
        opj_write_bytes_LE(p_buffer + 0xc,jp2->minversion,4);
        for (l_ftyp_data._4_4_ = 0; l_ftyp_data._4_4_ < jp2->numcl;
            l_ftyp_data._4_4_ = l_ftyp_data._4_4_ + 1) {
          opj_write_bytes_LE(p_buffer + 0x10,jp2->cl[l_ftyp_data._4_4_],4);
        }
        OVar1 = opj_stream_write_data(cio,p_buffer,(ulong)p_value,p_manager);
        jp2_local._4_4_ = (uint)(OVar1 == p_value);
        if (jp2_local._4_4_ == 0) {
          opj_event_msg(p_manager,1,"Error while writing ftyp data to stream\n");
        }
        opj_free(p_buffer);
      }
      return jp2_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x6f7,
                  "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x6f6,
                "OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_write_ftyp(opj_jp2_t *jp2,
                                   opj_stream_private_t *cio,
                                   opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_ftyp_size;
    OPJ_BYTE * l_ftyp_data, * l_current_data_ptr;
    OPJ_BOOL l_result;

    /* preconditions */
    assert(cio != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    l_ftyp_size = 16 + 4 * jp2->numcl;

    l_ftyp_data = (OPJ_BYTE *) opj_calloc(1, l_ftyp_size);

    if (l_ftyp_data == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to handle ftyp data\n");
        return OPJ_FALSE;
    }

    l_current_data_ptr = l_ftyp_data;

    opj_write_bytes(l_current_data_ptr, l_ftyp_size, 4); /* box size */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, JP2_FTYP, 4); /* FTYP */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, jp2->brand, 4); /* BR */
    l_current_data_ptr += 4;

    opj_write_bytes(l_current_data_ptr, jp2->minversion, 4); /* MinV */
    l_current_data_ptr += 4;

    for (i = 0; i < jp2->numcl; i++)  {
        opj_write_bytes(l_current_data_ptr, jp2->cl[i], 4); /* CL */
    }

    l_result = (opj_stream_write_data(cio, l_ftyp_data, l_ftyp_size,
                                      p_manager) == l_ftyp_size);
    if (! l_result) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error while writing ftyp data to stream\n");
    }

    opj_free(l_ftyp_data);

    return l_result;
}